

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O3

void __thiscall
CTcMake::build_symbol_file
          (CTcMake *this,CTcHostIfc *hostifc,CResLoader *res_loader,textchar_t *src_fname,
          textchar_t *sym_fname,CTcMakeModule *src_mod,int *error_count,int *warning_count)

{
  CTcMain *this_00;
  long lVar1;
  void *pvVar2;
  int err;
  size_t sVar3;
  FILE *pFVar4;
  char *pcVar5;
  char *name;
  long *in_FS_OFFSET;
  err_frame_t err_cur__;
  CVmFile *local_120;
  uint local_110 [2];
  long local_108;
  void *local_100;
  __jmp_buf_tag local_f8;
  
  local_120 = (CVmFile *)0x0;
  G_err_frame::__tls_init();
  local_108 = *in_FS_OFFSET;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)local_110;
  local_110[0] = _setjmp(&local_f8);
  if (local_110[0] == 0) {
    CTcMain::init((EVP_PKEY_CTX *)hostifc);
    set_compiler_options(this);
    pcVar5 = (src_mod->orig_name_).buf_;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = "";
    }
    err = CTcTokenizer::set_source(G_tok,src_fname,pcVar5);
    this_00 = G_tcmain;
    if (err == 0) {
      G_prs->field_0xec = G_prs->field_0xec | 4;
      CTcTokenizer::next(G_tok);
      pcVar5 = (src_mod->orig_name_).buf_;
      name = "";
      if (pcVar5 != (char *)0x0) {
        name = pcVar5;
      }
      CTcParser::set_module_info(G_prs,name,src_mod->seqno_);
      CTcParser::set_source_text_group_mode(G_prs,this->src_group_mode_);
      CTcParser::parse_top(G_prs);
      if (G_tcmain->error_count_ == 0) {
        pFVar4 = fopen(sym_fname,"wb");
        if (pFVar4 == (FILE *)0x0) {
          CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2968,sym_fname);
        }
        else {
          local_120 = (CVmFile *)operator_new(0x10);
          local_120->fp_ = (osfildef *)0x0;
          local_120->seek_base_ = 0;
          local_120->fp_ = (osfildef *)pFVar4;
          local_120->seek_base_ = 0;
          CTcParser::write_symbol_file(G_prs,local_120,this);
        }
      }
    }
    else {
      sVar3 = strlen(src_fname);
      CTcMain::log_error(this_00,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,err,sVar3 & 0xffffffff,
                         src_fname);
    }
  }
  if (-1 < (short)local_110[0]) {
    local_110[0] = local_110[0] | 0x8000;
    *error_count = *error_count + G_tcmain->error_count_;
    *warning_count = *warning_count + G_tcmain->warning_count_;
    if (local_120 != (CVmFile *)0x0) {
      if (local_120 != (CVmFile *)0x0) {
        CVmFile::~CVmFile(local_120);
      }
      operator_delete(local_120,0x10);
    }
    if ((*error_count != 0) || ((this->warnings_as_errors_ != 0 && (*warning_count != 0)))) {
      remove(sym_fname);
    }
    CTcMain::terminate();
  }
  lVar1 = local_108;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = lVar1;
  if ((local_110[0] & 0x4001) != 0) {
    G_err_frame::__tls_init();
    if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
      G_err_frame::__tls_init();
      free(*(void **)(*in_FS_OFFSET + 0x10));
    }
    pvVar2 = local_100;
    G_err_frame::__tls_init();
    *(void **)(*in_FS_OFFSET + 0x10) = pvVar2;
    err_rethrow();
  }
  if ((local_110[0] & 2) != 0) {
    free(local_100);
  }
  return;
}

Assistant:

void CTcMake::build_symbol_file(CTcHostIfc *hostifc,
                                CResLoader *res_loader,
                                const textchar_t *src_fname,
                                const textchar_t *sym_fname,
                                CTcMakeModule *src_mod,
                                int *error_count, int *warning_count)
{
    osfildef *fpout;
    CVmFile *volatile fp = 0;

    err_try
    {
        int err;
        
        /* initialize the compiler */
        CTcMain::init(hostifc, res_loader, source_charset_);

        /* set options */
        set_compiler_options();
        
        /* set up the tokenizer with the main input file */
        err = G_tok->set_source(src_fname, src_mod->get_orig_name());
        if (err != 0)
        {
            G_tcmain->log_error(0, 0, TC_SEV_ERROR, err,
                                (int)strlen(src_fname), src_fname);
            goto done;
        }
        
        /* parse in syntax-only mode */
        G_prs->set_syntax_only(TRUE);

        /* read the first token */
        G_tok->next();

        /* give the parser the module information */
        G_prs->set_module_info(
            src_mod->get_orig_name(), src_mod->get_seqno());

        /* set the sourceTextGroup mode */
        G_prs->set_source_text_group_mode(src_group_mode_);

        /* parse at the top level */
        G_prs->parse_top();

        /* if no errors occurred, write the symbol file */
        if (G_tcmain->get_error_count() == 0)
        {
            /* set up the output file */
            fpout = osfopwb(sym_fname, OSFTT3SYM);
            if (fpout == 0)
            {
                G_tcmain->log_error(0, 0, TC_SEV_ERROR,
                                    TCERR_MAKE_CANNOT_CREATE_SYM, sym_fname);
                goto done;
            }
            fp = new CVmFile();
            fp->set_file(fpout, 0);

            /* write the symbol file */
            G_prs->write_symbol_file(fp, this);
        }

    done: ;
    }